

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# botp.c
# Opt level: O2

bool_t botpOCRAStepV(char *otp,octet *q,size_t q_len,tm_time_t t,void *state)

{
  int iVar1;
  
  memCopy((void *)((long)state + 0x10),(void *)((long)state + 8),8);
  botpOCRAStepR((char *)((long)state + 0x330),q,q_len,t,state);
  iVar1 = strCmp((char *)((long)state + 0x330),otp);
  if (iVar1 != 0) {
    memCopy((void *)((long)state + 8),(void *)((long)state + 0x10),8);
  }
  return (uint)(iVar1 == 0);
}

Assistant:

bool_t botpOCRAStepV(const char* otp, const octet q[], size_t q_len, 
	tm_time_t t, void* state)
{
	botp_ocra_st* st = (botp_ocra_st*)state;
	// pre
	ASSERT(strIsValid(otp));
	ASSERT(memIsDisjoint2(otp, strLen(otp) + 1, state, botpOCRA_keep()));
	// сохранить счетчик
	memCopy(st->ctr1, st->ctr, 8);
	// проверить пароль
	botpOCRAStepR(st->otp, q, q_len, t, state);
	if (strEq(st->otp, otp))
		return TRUE;
	// вернуться к первоначальному счетчику
	memCopy(st->ctr, st->ctr1, 8);
	return FALSE;
}